

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O3

Vec_Int_t * Ree_ManComputeCuts(Gia_Man_t *p,Vec_Int_t **pvXors,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  uint uVar4;
  Hash_IntMan_t *pHash;
  Vec_Int_t *__ptr;
  int *piVar5;
  Vec_Int_t *__ptr_00;
  Vec_Int_t *pVVar6;
  Vec_Int_t *vData;
  Vec_Int_t *p_00;
  long lVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  int iVar10;
  int fVerbose_00;
  size_t __size;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  double dVar16;
  int **local_70;
  
  pHash = (Hash_IntMan_t *)calloc(1,0x18);
  uVar14 = 1099;
  while( true ) {
    do {
      uVar13 = uVar14;
      uVar14 = uVar13 + 1;
    } while ((uVar13 & 1) != 0);
    if (uVar14 < 9) break;
    iVar9 = 5;
    while (uVar14 % (iVar9 - 2U) != 0) {
      uVar4 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar14 < uVar4) goto LAB_00669f6b;
    }
  }
LAB_00669f6b:
  __ptr = (Vec_Int_t *)malloc(0x10);
  uVar4 = uVar14;
  if (uVar13 < 0xf) {
    uVar4 = 0x10;
  }
  __ptr->nCap = uVar4;
  piVar5 = (int *)malloc((long)(int)uVar4 << 2);
  __ptr->pArray = piVar5;
  __ptr->nSize = uVar14;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0,(long)(int)uVar14 << 2);
  }
  pHash->vTable = __ptr;
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  __ptr_00->nCap = 0x1130;
  piVar5 = (int *)malloc(0x44c0);
  __ptr_00->pArray = piVar5;
  pHash->vObjs = __ptr_00;
  piVar5[0] = 0;
  piVar5[1] = 0;
  piVar5[2] = 0;
  piVar5[3] = 0;
  __ptr_00->nSize = 4;
  pHash->nRefs = 1;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar6->pArray = piVar5;
  vData = (Vec_Int_t *)malloc(0x10);
  vData->nCap = 1000;
  vData->nSize = 0;
  piVar5 = (int *)malloc(4000);
  vData->pArray = piVar5;
  uVar14 = p->nObjs;
  iVar9 = (~(p->vCos->nSize + p->vCis->nSize) + uVar14) * 0x1e;
  p_00 = (Vec_Int_t *)malloc(0x10);
  if (iVar9 - 1U < 0xf) {
    iVar9 = 0x10;
  }
  p_00->nCap = iVar9;
  if (iVar9 == 0) {
    p_00->pArray = (int *)0x0;
    if ((int)uVar14 < 1) goto LAB_0066a121;
    __size = (ulong)uVar14 * 4;
LAB_0066a0ed:
    piVar5 = (int *)malloc(__size);
LAB_0066a0f5:
    local_70 = &p_00->pArray;
    *local_70 = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar14;
  }
  else {
    piVar5 = (int *)malloc((long)iVar9 << 2);
    p_00->pArray = piVar5;
    if (iVar9 < (int)uVar14) {
      __size = (long)(int)uVar14 << 2;
      if (piVar5 == (int *)0x0) goto LAB_0066a0ed;
      piVar5 = (int *)realloc(piVar5,__size);
      goto LAB_0066a0f5;
    }
  }
  if (0 < (int)uVar14) {
    memset(piVar5,0,(ulong)uVar14 * 4);
  }
LAB_0066a121:
  local_70 = &p_00->pArray;
  p_00->nSize = uVar14;
  Gia_ManCleanValue(p);
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      iVar9 = pVVar8->pArray[lVar15];
      lVar7 = (long)iVar9;
      if ((lVar7 < 0) || (p->nObjs <= iVar9)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->nSize <= iVar9) goto LAB_0066a591;
      pGVar1 = p->pObjs + lVar7;
      p_00->pArray[lVar7] = p_00->nSize;
      Vec_IntPush(p_00,1);
      Vec_IntPush(p_00,1);
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555);
      Vec_IntPush(p_00,0xaa);
      lVar15 = lVar15 + 1;
      pVVar8 = p->vCis;
    } while (lVar15 < pVVar8->nSize);
  }
  if (pvXors != (Vec_Int_t **)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 1000;
    pVVar8->nSize = 0;
    piVar5 = (int *)malloc(4000);
    pVVar8->pArray = piVar5;
    *pvXors = pVVar8;
  }
  iVar9 = p->nObjs;
  if (iVar9 < 1) {
    uVar11 = 0;
  }
  else {
    uVar12 = 0;
    uVar11 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(undefined8 *)(p->pObjs + uVar12);
      uVar14 = (uint)uVar3;
      if ((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) {
        iVar9 = (int)uVar12;
        uVar14 = iVar9 - (uVar14 & 0x1fffffff);
        if ((int)uVar14 < 0) {
LAB_0066a572:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar13 = p_00->nSize;
        if ((int)uVar13 <= (int)uVar14) goto LAB_0066a572;
        piVar5 = *local_70;
        uVar14 = piVar5[uVar14];
        if (((long)(int)uVar14 < 0) || (uVar13 <= uVar14)) {
LAB_0066a5b0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        uVar4 = iVar9 - ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff);
        if (((int)uVar4 < 0) || (uVar13 <= uVar4)) goto LAB_0066a572;
        uVar4 = piVar5[uVar4];
        if (((long)(int)uVar4 < 0) || (uVar13 <= uVar4)) goto LAB_0066a5b0;
        if (pvXors == (Vec_Int_t **)0x0) {
          pVVar8 = (Vec_Int_t *)0x0;
        }
        else {
          pVVar8 = *pvXors;
        }
        Ree_ManCutMerge(p,iVar9,piVar5 + (int)uVar14,piVar5 + (int)uVar4,pVVar6,pHash,vData,pVVar8);
        if (uVar13 <= uVar12) {
LAB_0066a591:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar5[uVar12] = uVar13;
        iVar9 = pVVar6->nSize;
        if ((long)iVar9 < 1) goto LAB_0066a572;
        piVar5 = pVVar6->pArray;
        lVar15 = 0;
        do {
          Vec_IntPush(p_00,piVar5[lVar15]);
          lVar15 = lVar15 + 1;
        } while (iVar9 != lVar15);
        uVar11 = (ulong)(uint)((int)uVar11 + *piVar5);
        iVar9 = p->nObjs;
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)iVar9);
  }
  if (fVerbose != 0) {
    uVar14 = iVar9 + ~(p->vCos->nSize + p->vCis->nSize);
    dVar16 = (double)(int)uVar14;
    printf("AIG nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n",
           SUB84((double)(int)uVar11 / dVar16,0),(double)p_00->nSize / dVar16,(ulong)uVar14,uVar11);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
  }
  free(pVVar6);
  if (*local_70 != (int *)0x0) {
    free(*local_70);
  }
  free(p_00);
  pVVar6 = Ree_ManDeriveAdds(pHash,vData,fVerbose_00);
  qsort(pVVar6->pArray,(long)(pVVar6->nSize / 6),0x18,Ree_ManCompare);
  if (fVerbose != 0) {
    iVar9 = __ptr_00->nSize;
    iVar10 = iVar9 + 3;
    if (-1 < iVar9) {
      iVar10 = iVar9;
    }
    printf("Adders = %d.  Total cuts = %d.  Hashed cuts = %d.  Hashed/Adders = %.2f.\n",
           SUB84(((double)((iVar10 >> 2) + -1) * 6.0) / (double)pVVar6->nSize,0),
           (ulong)(uint)(pVVar6->nSize / 6),(ulong)(uint)(vData->nSize / 3));
  }
  if (vData->pArray != (int *)0x0) {
    free(vData->pArray);
  }
  free(vData);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  free(pHash);
  Ree_ManRemoveTrivial(p,pVVar6);
  Ree_ManRemoveContained(p,pVVar6);
  return pVVar6;
}

Assistant:

Vec_Int_t * Ree_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvXors, int fVerbose )
{
    extern void Ree_ManRemoveTrivial( Gia_Man_t * p, Vec_Int_t * vAdds );
    extern void Ree_ManRemoveContained( Gia_Man_t * p, Vec_Int_t * vAdds );
    Gia_Obj_t * pObj; 
    int * pList0, * pList1, i, nCuts = 0;
    Hash_IntMan_t * pHash = Hash_IntManStart( 1000 );
    Vec_Int_t * vAdds;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vData = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManCleanValue( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        Vec_IntWriteEntry( vCuts, Gia_ObjId(p, pObj), Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, Gia_ObjId(p, pObj) );
        Vec_IntPush( vCuts, 0xAA );
    }
    if ( pvXors ) *pvXors = Vec_IntAlloc( 1000 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pList0 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId0(pObj, i)) );
        pList1 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId1(pObj, i)) );
        Ree_ManCutMerge( p, i, pList0, pList1, vTemp, pHash, vData, pvXors ? *pvXors : NULL );
        Vec_IntWriteEntry( vCuts, i, Vec_IntSize(vCuts) );
        Vec_IntAppend( vCuts, vTemp );
        nCuts += Vec_IntEntry( vTemp, 0 );
    }
    if ( fVerbose )
        printf( "AIG nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 1.0*Vec_IntSize(vCuts)/Gia_ManAndNum(p) );
    Vec_IntFree( vTemp );
    Vec_IntFree( vCuts );
    vAdds = Ree_ManDeriveAdds( pHash, vData, fVerbose );
    qsort( Vec_IntArray(vAdds), (size_t)(Vec_IntSize(vAdds)/6), 24, (int (*)(const void *, const void *))Ree_ManCompare );
    if ( fVerbose )
        printf( "Adders = %d.  Total cuts = %d.  Hashed cuts = %d.  Hashed/Adders = %.2f.\n", 
            Vec_IntSize(vAdds)/6, Vec_IntSize(vData)/3, Hash_IntManEntryNum(pHash), 6.0*Hash_IntManEntryNum(pHash)/Vec_IntSize(vAdds) );
    Vec_IntFree( vData );
    Hash_IntManStop( pHash );
    Ree_ManRemoveTrivial( p, vAdds );
    Ree_ManRemoveContained( p, vAdds );
    //Ree_ManPrintAdders( vAdds, 1 );
    return vAdds;
}